

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void update_monsters(_Bool full)

{
  wchar_t wVar1;
  monster_conflict *mon;
  wchar_t idx;
  
  idx = L'\x01';
  while( true ) {
    wVar1 = cave_monster_max(cave);
    if (wVar1 <= idx) break;
    mon = (monster_conflict *)cave_monster(cave,idx);
    if (mon->race != (monster_race *)0x0) {
      update_mon(mon,(chunk *)cave,full);
    }
    idx = idx + L'\x01';
  }
  return;
}

Assistant:

void update_monsters(bool full)
{
	int i;

	/* Update each (live) monster */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Update the monster if alive */
		if (mon->race)
			update_mon(mon, cave, full);
	}
}